

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O0

int jpc_dec_process_rgn(jpc_dec_t *dec,jpc_ms_t *ms)

{
  jpc_dec_tile_t *pjVar1;
  jpc_msparms_t *rgn_00;
  jpc_dec_tile_t *tile;
  jpc_rgn_t *rgn;
  jpc_ms_t *ms_local;
  jpc_dec_t *dec_local;
  
  rgn_00 = &ms->parms;
  if (dec->numcomps <= (int)(rgn_00->sot).tileno) {
    jas_eprintf("invalid component number in RGN marker segment\n");
    return -1;
  }
  if (dec->state == 4) {
    jpc_dec_cp_setfromrgn(dec->cp,&rgn_00->rgn);
  }
  else if (dec->state == 0x10) {
    pjVar1 = dec->curtile;
    if (pjVar1 == (jpc_dec_tile_t *)0x0) {
      return -1;
    }
    if (0 < pjVar1->partno) {
      return -1;
    }
    jpc_dec_cp_setfromrgn(pjVar1->cp,&rgn_00->rgn);
  }
  return 0;
}

Assistant:

static int jpc_dec_process_rgn(jpc_dec_t *dec, jpc_ms_t *ms)
{
	jpc_rgn_t *rgn = &ms->parms.rgn;
	jpc_dec_tile_t *tile;

	if (JAS_CAST(int, rgn->compno) >= dec->numcomps) {
		jas_eprintf("invalid component number in RGN marker segment\n");
		return -1;
	}
	switch (dec->state) {
	case JPC_MH:
		jpc_dec_cp_setfromrgn(dec->cp, rgn);
		break;
	case JPC_TPH:
		if (!(tile = dec->curtile)) {
			return -1;
		}
		if (tile->partno > 0) {
			return -1;
		}
		jpc_dec_cp_setfromrgn(tile->cp, rgn);
		break;
	}

	return 0;
}